

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall KktCheck::chStOfLagrangian(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  
  this->j = 0;
  iVar5 = this->numCol;
  if (0 < iVar5) {
    iVar7 = 0;
    bVar8 = true;
    do {
      piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar11 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar7] -
               (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar7];
      iVar10 = piVar1[iVar7];
      lVar9 = (long)iVar10;
      this->k = iVar10;
      if (iVar10 < piVar1[(long)iVar7 + 1]) {
        piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar10 = iVar10 + 1;
          dVar11 = dVar11 + pdVar4[piVar2[lVar9]] * pdVar3[lVar9];
          lVar9 = lVar9 + 1;
          this->k = iVar10;
        } while (lVar9 < piVar1[(long)iVar7 + 1]);
      }
      if (this->tol <= ABS(dVar11) && ABS(dVar11) != this->tol) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Column ",7);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->j]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," fails stationary of Lagrangian: dL/dx",0x26);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->j);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          poVar6 = std::ostream::_M_insert<double>(dVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", rather than zero.",0x13);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          iVar5 = this->numCol;
          iVar7 = this->j;
        }
        bVar8 = false;
      }
      iVar7 = iVar7 + 1;
      this->j = iVar7;
    } while (iVar7 < iVar5);
    if (!bVar8) {
      if (this->print == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KKT check error: Lagrangian is not stationary.\n",0x2f);
      }
      this->istrueGlb = true;
      return;
    }
  }
  if (this->print != 1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Stationarity of Lagrangian.\n",0x1c);
  return;
}

Assistant:

void KktCheck::chStOfLagrangian() {
	bool istrue = true;
	double lagrV;
	//A'y + c - z = 0
	for (j=0; j<numCol;j++) {
		lagrV = colCost[j] -colDual[j];
		for (k=Astart[j]; k<Astart[j+1]; k++) 
				lagrV = lagrV + rowDual[Aindex[k]]*Avalue[k];
				
		if (abs(lagrV) > tol) {
			if (print == 1) 
				cout<<"Column "<<cIndexRev[j]<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
				//cout<<"Column "<<j<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
			istrue = false;
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Stationarity of Lagrangian.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Lagrangian is not stationary.\n";
		istrueGlb = true;
	}

}